

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O0

uint32_t FastPForLib::gccbits(uint32_t v)

{
  undefined4 local_8;
  uint32_t v_local;
  
  if (v == 0) {
    local_8 = 0;
  }
  else {
    local_8 = 0x20 - LZCOUNT(v);
  }
  return local_8;
}

Assistant:

__attribute__((const)) inline uint32_t gccbits(const uint32_t v) {
#ifdef _MSC_VER
  if (v == 0) {
    return 0;
  }
  unsigned long answer;
  _BitScanReverse(&answer, v);
  return answer + 1;
#else
  return v == 0 ? 0 : 32 - __builtin_clz(v);
#endif
}